

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headlossmodel.cpp
# Opt level: O2

void __thiscall
DW_HeadLossModel::findHeadLoss
          (DW_HeadLossModel *this,Pipe *pipe,double flow,double *headLoss,double *gradient)

{
  double dVar1;
  ulong in_XMM0_Qb;
  double s;
  double local_60;
  double dfdq;
  double local_48;
  ulong uStack_40;
  double local_30;
  double local_28;
  
  local_48 = ABS(flow);
  uStack_40 = in_XMM0_Qb & 0x7fffffffffffffff;
  dVar1 = (pipe->super_Link).diameter;
  local_28 = pipe->resistance;
  local_30 = pipe->lossFactor;
  s = (this->super_HeadLossModel).viscosity * dVar1;
  dfdq = flow;
  if (local_48 <= s * 1570.79632679) {
    local_28 = local_28 * s * 50.265482464;
    dVar1 = local_30 * local_48 + local_28;
    local_28 = (local_30 + local_30) * local_48 + local_28;
  }
  else {
    local_60 = 0.0;
    dVar1 = frictionFactor(local_48,pipe->roughness / dVar1,s,&local_60);
    local_30 = dVar1 * local_28 + local_30;
    dVar1 = local_48 * local_30;
    local_28 = (local_30 + local_30) * local_48 + local_28 * local_60 * local_48 * local_48;
  }
  *headLoss = dVar1 * dfdq;
  *gradient = local_28;
  return;
}

Assistant:

void DW_HeadLossModel::findHeadLoss(Pipe* pipe, double flow,  double& headLoss,
    double& gradient)
{
    double q = abs(flow);
    double r = pipe->resistance;
    double k = pipe->lossFactor;
    double s = viscosity * pipe->diameter;

    // ... use Hagen-Poiseuille formula for laminar flow (Re <= 2000)

    if (q <= A2 * s)
    {
        r = 16.0 * PI * s * pipe->resistance;
        headLoss = flow * (r + k * q);
        gradient = r + 2.0 * k * q;
    }

    // ... use Colebrook formula for turbulent flow

    else
    {
        double dfdq = 0.0;
        double e = pipe->roughness / pipe->diameter;
        double f = frictionFactor(q, e, s, dfdq);
        double r1 = f * r + k;
        headLoss = r1 * q * flow;
        gradient = (2.0 * r1 * q) + (dfdq * r * q * q);
    }
}